

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O0

void __thiscall
TestRegenerateCmakeAddSubdirectory_SubDirsWithAndWithoutCmakeLists::Run
          (TestRegenerateCmakeAddSubdirectory_SubDirsWithAndWithoutCmakeLists *this)

{
  byte bVar1;
  path *this_00;
  value_type *pvVar2;
  path *lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  runtime_error *this_01;
  __type v;
  ostringstream oss;
  string expectedOutput;
  Component comp;
  TemporaryWorkingDirectory workdir;
  Component *in_stack_fffffffffffff3f0;
  undefined7 in_stack_fffffffffffff3f8;
  undefined1 in_stack_fffffffffffff3ff;
  path *in_stack_fffffffffffff410;
  path *in_stack_fffffffffffff418;
  path *in_stack_fffffffffffff420;
  string local_bc0 [39];
  byte local_b99;
  path *in_stack_fffffffffffff468;
  Component *in_stack_fffffffffffff470;
  char *in_stack_fffffffffffff4a8;
  TemporaryWorkingDirectory *in_stack_fffffffffffff4b0;
  Component *in_stack_fffffffffffff528;
  ostream *in_stack_fffffffffffff530;
  allocator local_a19;
  string local_a18 [960];
  undefined1 local_658 [832];
  undefined1 local_318 [720];
  TemporaryWorkingDirectory local_48;
  
  TemporaryWorkingDirectory::TemporaryWorkingDirectory
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
  TemporaryWorkingDirectory::operator()(&local_48);
  boost::filesystem::path::path(in_stack_fffffffffffff420,(value_type *)in_stack_fffffffffffff418);
  boost::filesystem::operator/(in_stack_fffffffffffff418,in_stack_fffffffffffff410);
  boost::filesystem::create_directories((path *)0x1593dd);
  boost::filesystem::path::~path((path *)0x1593ec);
  boost::filesystem::path::~path((path *)0x1593f9);
  TemporaryWorkingDirectory::operator()(&local_48);
  boost::filesystem::path::path(in_stack_fffffffffffff420,(value_type *)in_stack_fffffffffffff418);
  boost::filesystem::operator/(in_stack_fffffffffffff418,in_stack_fffffffffffff410);
  boost::filesystem::path::path(in_stack_fffffffffffff420,(value_type *)in_stack_fffffffffffff418);
  boost::filesystem::operator/
            ((path *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             &in_stack_fffffffffffff3f0->root);
  boost::filesystem::create_directories((path *)0x159481);
  boost::filesystem::path::~path((path *)0x159490);
  boost::filesystem::path::~path((path *)0x15949d);
  boost::filesystem::path::~path((path *)0x1594aa);
  boost::filesystem::path::~path((path *)0x1594b7);
  this_00 = TemporaryWorkingDirectory::operator()(&local_48);
  boost::filesystem::path::path(this_00,(value_type *)in_stack_fffffffffffff418);
  boost::filesystem::operator/(in_stack_fffffffffffff418,in_stack_fffffffffffff410);
  boost::filesystem::path::path(this_00,(value_type *)in_stack_fffffffffffff418);
  boost::filesystem::operator/
            ((path *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             &in_stack_fffffffffffff3f0->root);
  boost::filesystem::path::path(this_00,(value_type *)in_stack_fffffffffffff418);
  boost::filesystem::operator/
            ((path *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             &in_stack_fffffffffffff3f0->root);
  pvVar2 = boost::filesystem::path::c_str((path *)0x159574);
  std::ofstream::ofstream(local_318,pvVar2,_S_out);
  std::ofstream::close();
  std::ofstream::~ofstream(local_318);
  boost::filesystem::path::~path((path *)0x1595b4);
  boost::filesystem::path::~path((path *)0x1595c1);
  boost::filesystem::path::~path((path *)0x1595ce);
  boost::filesystem::path::~path((path *)0x1595db);
  boost::filesystem::path::~path((path *)0x1595e8);
  boost::filesystem::path::~path((path *)0x1595f5);
  lhs = TemporaryWorkingDirectory::operator()(&local_48);
  boost::filesystem::path::path(this_00,(value_type *)lhs);
  boost::filesystem::operator/(lhs,in_stack_fffffffffffff410);
  boost::filesystem::path::path(this_00,(value_type *)lhs);
  boost::filesystem::operator/
            ((path *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             &in_stack_fffffffffffff3f0->root);
  boost::filesystem::create_directories((path *)0x15967d);
  boost::filesystem::path::~path((path *)0x15968c);
  boost::filesystem::path::~path((path *)0x159699);
  boost::filesystem::path::~path((path *)0x1596a6);
  boost::filesystem::path::~path((path *)0x1596b3);
  __lhs = &TemporaryWorkingDirectory::operator()(&local_48)->m_pathname;
  boost::filesystem::path::path(this_00,(value_type *)lhs);
  boost::filesystem::operator/(lhs,(path *)__lhs);
  boost::filesystem::path::path(this_00,(value_type *)lhs);
  boost::filesystem::operator/
            ((path *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             &in_stack_fffffffffffff3f0->root);
  boost::filesystem::path::path(this_00,(value_type *)lhs);
  boost::filesystem::operator/
            ((path *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             &in_stack_fffffffffffff3f0->root);
  pvVar2 = boost::filesystem::path::c_str((path *)0x159770);
  std::ofstream::ofstream(local_658,pvVar2,_S_out);
  std::ofstream::close();
  std::ofstream::~ofstream(local_658);
  boost::filesystem::path::~path((path *)0x1597b0);
  boost::filesystem::path::~path((path *)0x1597bd);
  boost::filesystem::path::~path((path *)0x1597ca);
  boost::filesystem::path::~path((path *)0x1597d7);
  boost::filesystem::path::~path((path *)0x1597e4);
  boost::filesystem::path::~path((path *)0x1597f1);
  __rhs = &TemporaryWorkingDirectory::operator()(&local_48)->m_pathname;
  boost::filesystem::path::path(this_00,(value_type *)lhs);
  boost::filesystem::operator/(lhs,(path *)__lhs);
  boost::filesystem::path::path(this_00,(value_type *)lhs);
  boost::filesystem::operator/
            ((path *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             &in_stack_fffffffffffff3f0->root);
  boost::filesystem::create_directories((path *)0x159879);
  boost::filesystem::path::~path((path *)0x159888);
  boost::filesystem::path::~path((path *)0x159895);
  boost::filesystem::path::~path((path *)0x1598a2);
  boost::filesystem::path::~path((path *)0x1598af);
  boost::filesystem::path::path(this_00,(value_type *)lhs);
  Component::Component(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  boost::filesystem::path::~path((path *)0x1598e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a18,"add_subdirectory(SubComponentA)\nadd_subdirectory(SubComponentB)\n",
             &local_a19);
  std::allocator<char>::~allocator((allocator<char> *)&local_a19);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffff468);
  RegenerateCmakeAddSubdirectory(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(__lhs,__rhs);
  std::__cxx11::string::~string(local_bc0);
  local_b99 = bVar1 & 1;
  if (local_b99 == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Assertion failed: oss.str() == expectedOutput");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffff468);
  std::__cxx11::string::~string(local_a18);
  Component::~Component(in_stack_fffffffffffff3f0);
  TemporaryWorkingDirectory::~TemporaryWorkingDirectory
            ((TemporaryWorkingDirectory *)in_stack_fffffffffffff3f0);
  return;
}

Assistant:

TEST(RegenerateCmakeAddSubdirectory_SubDirsWithAndWithoutCmakeLists) {
  TemporaryWorkingDirectory workdir(name);
  filesystem::create_directories(workdir() / "MyComponent");
  filesystem::create_directories(workdir() / "MyComponent" / "SubComponentA");
  std::ofstream((workdir() / "MyComponent" / "SubComponentA" / "CMakeLists.txt").c_str()).close();
  filesystem::create_directories(workdir() / "MyComponent" / "SubComponentB");
  std::ofstream((workdir() / "MyComponent" / "SubComponentB" / "CMakeLists.txt").c_str()).close();
  filesystem::create_directories(workdir() / "MyComponent" / "Data");

  Component comp("./MyComponent/");

  const std::string expectedOutput(
    "add_subdirectory(SubComponentA)\n"
    "add_subdirectory(SubComponentB)\n");

  std::ostringstream oss;
  RegenerateCmakeAddSubdirectory(oss, comp);

  ASSERT(oss.str() == expectedOutput);
}